

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

xmlCharEncodingHandlerPtr
xmlNewCharEncodingHandler
          (char *name,xmlCharEncodingInputFunc input,xmlCharEncodingOutputFunc output)

{
  __int32_t _Var1;
  __int32_t *p_Var2;
  char *pcVar3;
  __int32_t **pp_Var4;
  ulong uVar5;
  xmlCharEncodingHandlerPtr handler;
  char upper [500];
  char local_218 [504];
  
  pcVar3 = xmlGetEncodingAlias(name);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = name;
  }
  if (pcVar3 == (char *)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0x1b,6000,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                    (char *)0x0,0,0,"xmlNewCharEncodingHandler : no name !\n",0);
  }
  else {
    pp_Var4 = __ctype_toupper_loc();
    p_Var2 = *pp_Var4;
    uVar5 = 0;
    do {
      _Var1 = p_Var2[pcVar3[uVar5]];
      local_218[uVar5] = (char)_Var1;
      if ((char)_Var1 == '\0') goto LAB_00143da8;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 499);
    uVar5 = 499;
LAB_00143da8:
    local_218[uVar5 & 0xffffffff] = '\0';
    pcVar3 = (*xmlMemStrdup)(local_218);
    if (pcVar3 != (char *)0x0) {
      handler = (xmlCharEncodingHandlerPtr)(*xmlMalloc)(0x28);
      if (handler != (xmlCharEncodingHandlerPtr)0x0) {
        handler->input = input;
        handler->output = output;
        handler->name = pcVar3;
        handler->iconv_in = (iconv_t)0x0;
        handler->iconv_out = (iconv_t)0x0;
        xmlRegisterCharEncodingHandler(handler);
        return handler;
      }
      (*xmlFree)(pcVar3);
    }
    __xmlSimpleError(0x1b,2,(xmlNodePtr)0x0,(char *)0x0,
                     "xmlNewCharEncodingHandler : out of memory !\n");
  }
  return (xmlCharEncodingHandlerPtr)0x0;
}

Assistant:

xmlCharEncodingHandlerPtr
xmlNewCharEncodingHandler(const char *name,
                          xmlCharEncodingInputFunc input,
                          xmlCharEncodingOutputFunc output) {
    xmlCharEncodingHandlerPtr handler;
    const char *alias;
    char upper[500];
    int i;
    char *up = NULL;

    /*
     * Do the alias resolution
     */
    alias = xmlGetEncodingAlias(name);
    if (alias != NULL)
	name = alias;

    /*
     * Keep only the uppercase version of the encoding.
     */
    if (name == NULL) {
        xmlEncodingErr(XML_I18N_NO_NAME,
		       "xmlNewCharEncodingHandler : no name !\n", NULL);
	return(NULL);
    }
    for (i = 0;i < 499;i++) {
        upper[i] = toupper(name[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;
    up = xmlMemStrdup(upper);
    if (up == NULL) {
        xmlEncodingErrMemory("xmlNewCharEncodingHandler : out of memory !\n");
	return(NULL);
    }

    /*
     * allocate and fill-up an handler block.
     */
    handler = (xmlCharEncodingHandlerPtr)
              xmlMalloc(sizeof(xmlCharEncodingHandler));
    if (handler == NULL) {
        xmlFree(up);
        xmlEncodingErrMemory("xmlNewCharEncodingHandler : out of memory !\n");
	return(NULL);
    }
    memset(handler, 0, sizeof(xmlCharEncodingHandler));
    handler->input = input;
    handler->output = output;
    handler->name = up;

#ifdef LIBXML_ICONV_ENABLED
    handler->iconv_in = NULL;
    handler->iconv_out = NULL;
#endif
#ifdef LIBXML_ICU_ENABLED
    handler->uconv_in = NULL;
    handler->uconv_out = NULL;
#endif

    /*
     * registers and returns the handler.
     */
    xmlRegisterCharEncodingHandler(handler);
#ifdef DEBUG_ENCODING
    xmlGenericError(xmlGenericErrorContext,
	    "Registered encoding handler for %s\n", name);
#endif
    return(handler);
}